

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddPolyline
          (ImDrawList *this,ImVec2 *points,int points_count,ImU32 col,bool closed,float thickness)

{
  float *pfVar1;
  ImDrawVert *pIVar2;
  ImDrawIdx IVar3;
  ImDrawIdx IVar4;
  uint uVar5;
  ImVec2 IVar6;
  ulong uVar7;
  char cVar8;
  ImVec2 IVar9;
  ImDrawIdx *pIVar10;
  ImDrawIdx IVar11;
  ImU32 IVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  ImVec2 IVar17;
  ImDrawIdx IVar18;
  undefined7 in_register_00000081;
  ImVec2 IVar19;
  short sVar20;
  uint uVar21;
  ImVec2 IVar22;
  short sVar23;
  uint uVar24;
  ImDrawIdx IVar25;
  ImVec2 IVar26;
  float *pfVar27;
  ImVec2 IVar28;
  ImVec2 IVar29;
  ulong uVar30;
  bool bVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float afStack_98 [2];
  undefined8 uStack_90;
  ImVec2 local_88;
  ImVec2 local_80;
  ImVec2 local_78;
  ImVec2 local_70 [2];
  ImVec2 local_60;
  undefined1 local_58 [16];
  ImVec2 local_40;
  float local_38;
  ImU32 local_34;
  
  if (1 < points_count) {
    IVar6.y = 0.0;
    IVar6.x = (float)points_count;
    local_70[1] = this->_Data->TexUvWhitePixel;
    local_78 = (ImVec2)(ulong)(points_count - 1U);
    local_70[0].x = (float)CONCAT71(in_register_00000081,closed);
    uVar5 = points_count - 1U;
    if (closed) {
      uVar5 = points_count;
    }
    IVar28.y = 0.0;
    IVar28.x = (float)uVar5;
    local_38 = thickness;
    local_34 = col;
    if ((this->Flags & 1) == 0) {
      uStack_90 = 0x10a976;
      PrimReserve(this,uVar5 * 6,uVar5 * 4);
      if (0 < (int)uVar5) {
        fVar34 = local_38 * 0.5;
        IVar26.x = 1.4013e-45;
        IVar26.y = 0.0;
        IVar12 = local_34;
        local_60 = IVar6;
        local_38 = fVar34;
        do {
          IVar22.x = 0.0;
          IVar22.y = 0.0;
          IVar19 = IVar26;
          if (IVar6 == IVar26) {
            IVar19 = IVar22;
          }
          fVar37 = points[(long)IVar19].x - points[(long)IVar26 - 1].x;
          fVar39 = points[(long)IVar19].y - points[(long)IVar26 - 1].y;
          fVar32 = fVar37 * fVar37 + fVar39 * fVar39;
          if (0.0 < fVar32) {
            if (fVar32 < 0.0) {
              local_40.x = fVar37;
              local_58._0_4_ = fVar39;
              uStack_90 = 0x10aa08;
              fVar32 = sqrtf(fVar32);
              IVar6 = local_60;
              fVar34 = local_38;
              fVar37 = local_40.x;
              fVar39 = (float)local_58._0_4_;
              IVar12 = local_34;
            }
            else {
              fVar32 = SQRT(fVar32);
            }
            fVar37 = fVar37 * (1.0 / fVar32);
            fVar39 = fVar39 * (1.0 / fVar32);
          }
          fVar37 = fVar37 * fVar34;
          fVar39 = fVar39 * fVar34;
          pIVar2 = this->_VtxWritePtr;
          (pIVar2->pos).x = points[(long)IVar26 - 1].x + fVar39;
          (pIVar2->pos).y = points[(long)IVar26 - 1].y - fVar37;
          pIVar2->uv = local_70[1];
          pIVar2 = this->_VtxWritePtr;
          pIVar2->col = IVar12;
          pIVar2[1].pos.x = points[(long)IVar19].x + fVar39;
          pIVar2[1].pos.y = points[(long)IVar19].y - fVar37;
          pIVar2[1].uv = local_70[1];
          pIVar2 = this->_VtxWritePtr;
          pIVar2[1].col = IVar12;
          pIVar2[2].pos.x = points[(long)IVar19].x - fVar39;
          pIVar2[2].pos.y = points[(long)IVar19].y + fVar37;
          pIVar2[2].uv = local_70[1];
          pIVar2 = this->_VtxWritePtr;
          pIVar2[2].col = IVar12;
          pIVar2[3].pos.x = points[(long)IVar26 - 1].x - fVar39;
          pIVar2[3].pos.y = fVar37 + points[(long)IVar26 - 1].y;
          pIVar2[3].uv = local_70[1];
          pIVar2 = this->_VtxWritePtr;
          pIVar2[3].col = IVar12;
          this->_VtxWritePtr = pIVar2 + 4;
          uVar5 = this->_VtxCurrentIdx;
          pIVar10 = this->_IdxWritePtr;
          IVar4 = (ImDrawIdx)uVar5;
          *pIVar10 = IVar4;
          pIVar10[1] = IVar4 + 1;
          pIVar10[2] = IVar4 + 2;
          pIVar10[3] = IVar4;
          pIVar10[4] = IVar4 + 2;
          pIVar10[5] = IVar4 + 3;
          this->_IdxWritePtr = pIVar10 + 6;
          this->_VtxCurrentIdx = uVar5 + 4;
          bVar31 = IVar26 != IVar28;
          IVar26 = (ImVec2)((long)IVar26 + 1);
        } while (bVar31);
      }
    }
    else {
      iVar13 = 0xc;
      if (1.0 < thickness) {
        iVar13 = 0x12;
      }
      local_70[0].y = (float)(points_count * 3);
      if (1.0 < thickness) {
        local_70[0].y = (float)(points_count * 4);
      }
      uStack_90 = 0x10ab86;
      PrimReserve(this,iVar13 * uVar5,(int)local_70[0].y);
      lVar15 = -((ulong)(((uint)(1.0 < thickness) * 2 + 3) * points_count) * 8 + 0xf &
                0xfffffffffffffff0);
      pfVar27 = (float *)((long)&local_88 + lVar15);
      local_80 = IVar6;
      IVar19.y = 0.0;
      IVar19.x = (float)points_count;
      local_88 = IVar28;
      local_40 = IVar19;
      IVar12 = local_34;
      if (0 < (int)uVar5) {
        IVar29.x = 1.4013e-45;
        IVar29.y = 0.0;
        do {
          IVar9.x = 0.0;
          IVar9.y = 0.0;
          IVar6 = IVar29;
          if (IVar19 == IVar29) {
            IVar6 = IVar9;
          }
          fVar34 = points[(long)IVar6].x - points[(long)IVar29 - 1].x;
          fVar37 = points[(long)IVar6].y - points[(long)IVar29 - 1].y;
          fVar39 = fVar34 * fVar34 + fVar37 * fVar37;
          if (0.0 < fVar39) {
            if (fVar39 < 0.0) {
              local_58 = ZEXT416((uint)fVar34);
              local_60.x = fVar37;
              *(undefined8 *)((long)&uStack_90 + lVar15) = 0x10ac3e;
              fVar39 = sqrtf(fVar39);
              IVar19 = local_40;
              fVar34 = (float)local_58._0_4_;
              fVar37 = local_60.x;
              IVar12 = local_34;
            }
            else {
              fVar39 = SQRT(fVar39);
            }
            fVar34 = fVar34 * (1.0 / fVar39);
            fVar37 = fVar37 * (1.0 / fVar39);
          }
          *(float *)((long)&uStack_90 + (long)IVar29 * 8 + lVar15) = fVar37;
          *(float *)((long)&uStack_90 + (long)IVar29 * 8 + lVar15 + 4) = -fVar34;
          bVar31 = IVar29 != IVar28;
          IVar29 = (ImVec2)((long)IVar29 + 1);
        } while (bVar31);
      }
      pfVar1 = pfVar27 + (long)IVar19 * 2;
      cVar8 = SUB41(local_70[0].x,0);
      if (cVar8 == '\0') {
        *(undefined8 *)(pfVar1 + -2) = *(undefined8 *)(pfVar1 + -4);
      }
      uVar5 = IVar12 & 0xffffff;
      if (local_38 <= 1.0) {
        if (cVar8 == '\0') {
          fVar34 = *pfVar27;
          fVar37 = *(float *)((long)&local_88 + lVar15 + 4);
          fVar39 = points->x;
          fVar32 = points->y;
          *pfVar1 = fVar34 + fVar39;
          pfVar1[1] = fVar37 + fVar32;
          pfVar1[2] = fVar39 - fVar34;
          pfVar1[3] = fVar32 - fVar37;
          uVar7 = (ulong)local_78 & 0xffffffff;
          fVar34 = points[uVar7].x;
          fVar37 = points[uVar7].y;
          uVar16 = (ulong)(uint)((int)local_78.x * 2);
          *(ulong *)(pfVar1 + uVar16 * 2) =
               CONCAT44(*(float *)((long)&local_88 + uVar7 * 8 + lVar15 + 4) + fVar37,
                        pfVar27[uVar7 * 2] + fVar34);
          *(ulong *)(pfVar1 + uVar16 * 2 + 2) =
               CONCAT44(fVar37 - *(float *)((long)&local_88 + uVar7 * 8 + lVar15 + 4),
                        fVar34 - pfVar27[uVar7 * 2]);
        }
        if (0 < (int)local_88.x) {
          pIVar10 = this->_IdxWritePtr;
          local_58._0_8_ = ((ulong)local_88 & 0xffffffff) * 0x18;
          uVar7 = 1;
          lVar14 = 0;
          uVar21 = this->_VtxCurrentIdx;
          do {
            uVar16 = uVar7 & 0xffffffff;
            uVar24 = uVar21 + 3;
            if ((long)IVar19 * 0x18 + -0x18 == lVar14) {
              uVar16 = 0;
              uVar24 = this->_VtxCurrentIdx;
            }
            fVar37 = (*(float *)((long)&uStack_90 + uVar7 * 8 + lVar15) + pfVar27[uVar16 * 2]) * 0.5
            ;
            fVar39 = (*(float *)((long)&uStack_90 + uVar7 * 8 + lVar15 + 4) +
                     *(float *)((long)&local_88 + uVar16 * 8 + lVar15 + 4)) * 0.5;
            fVar32 = fVar37 * fVar37 + fVar39 * fVar39;
            fVar34 = 0.5;
            if (0.5 <= fVar32) {
              fVar34 = fVar32;
            }
            fVar37 = fVar37 * (1.0 / fVar34);
            fVar39 = (1.0 / fVar34) * fVar39;
            uVar30 = (ulong)(uint)((int)uVar16 * 2);
            fVar34 = points[uVar16].x;
            pfVar1[uVar30 * 2] = fVar34 + fVar37;
            fVar32 = points[uVar16].y;
            pfVar1[uVar30 * 2 + 1] = fVar32 + fVar39;
            pfVar1[uVar30 * 2 + 2] = fVar34 - fVar37;
            pfVar1[uVar30 * 2 + 3] = fVar32 - fVar39;
            sVar23 = (short)uVar24;
            *(short *)((long)pIVar10 + lVar14) = sVar23;
            sVar20 = (short)uVar21;
            *(short *)((long)pIVar10 + lVar14 + 2) = sVar20;
            *(short *)((long)pIVar10 + lVar14 + 4) = sVar20 + 2;
            *(short *)((long)pIVar10 + lVar14 + 6) = sVar20 + 2;
            *(short *)((long)pIVar10 + lVar14 + 8) = sVar23 + 2;
            *(short *)((long)pIVar10 + lVar14 + 10) = sVar23;
            *(short *)((long)pIVar10 + lVar14 + 0xc) = sVar23 + 1;
            *(short *)((long)pIVar10 + lVar14 + 0xe) = sVar20 + 1;
            *(short *)((long)pIVar10 + lVar14 + 0x10) = sVar20;
            *(short *)((long)pIVar10 + lVar14 + 0x12) = sVar20;
            *(short *)((long)pIVar10 + lVar14 + 0x14) = sVar23;
            *(short *)((long)pIVar10 + lVar14 + 0x16) = sVar23 + 1;
            uVar7 = uVar7 + 1;
            lVar14 = lVar14 + 0x18;
            uVar21 = uVar24;
          } while (local_58._0_8_ != lVar14);
          this->_IdxWritePtr = (ImDrawIdx *)((long)pIVar10 + lVar14);
          IVar19 = local_40;
          IVar12 = local_34;
        }
        uVar7 = 1;
        if (1 < (int)local_80.x) {
          uVar7 = (ulong)local_80 & 0xffffffff;
        }
        lVar15 = 0;
        do {
          this->_VtxWritePtr->pos = *(ImVec2 *)((long)&points->x + lVar15);
          this->_VtxWritePtr->uv = local_70[1];
          pIVar2 = this->_VtxWritePtr;
          pIVar2->col = IVar12;
          pIVar2[1].pos = *(ImVec2 *)((long)pfVar27 + lVar15 * 2 + (long)IVar19 * 8);
          this->_VtxWritePtr[1].uv = local_70[1];
          pIVar2 = this->_VtxWritePtr;
          pIVar2[1].col = uVar5;
          pIVar2[2].pos = *(ImVec2 *)((long)pfVar27 + lVar15 * 2 + (long)IVar19 * 8 + 8);
          this->_VtxWritePtr[2].uv = local_70[1];
          pIVar2 = this->_VtxWritePtr;
          pIVar2[2].col = uVar5;
          this->_VtxWritePtr = pIVar2 + 3;
          lVar15 = lVar15 + 8;
        } while (uVar7 * 8 != lVar15);
      }
      else {
        fVar34 = (local_38 + -1.0) * 0.5;
        if (cVar8 == '\0') {
          fVar33 = fVar34 + 1.0;
          fVar37 = *(float *)((long)&local_88 + lVar15 + 4);
          fVar36 = fVar33 * *pfVar27;
          fVar38 = fVar33 * fVar37;
          fVar39 = points->x;
          fVar32 = points->y;
          fVar35 = *pfVar27 * fVar34;
          fVar37 = fVar37 * fVar34;
          *pfVar1 = fVar36 + fVar39;
          pfVar1[1] = fVar38 + fVar32;
          pfVar1[2] = fVar35 + fVar39;
          pfVar1[3] = fVar37 + fVar32;
          pfVar1[4] = fVar39 - fVar35;
          pfVar1[5] = fVar32 - fVar37;
          pfVar1[6] = fVar39 - fVar36;
          pfVar1[7] = fVar32 - fVar38;
          uVar7 = (ulong)local_78 & 0xffffffff;
          fVar37 = points[uVar7].x;
          fVar39 = points[uVar7].y;
          uVar16 = (ulong)(uint)((int)local_78.x << 2);
          *(ulong *)(pfVar1 + uVar16 * 2) =
               CONCAT44(*(float *)((long)&local_88 + uVar7 * 8 + lVar15 + 4) * fVar33 + fVar39,
                        pfVar27[uVar7 * 2] * fVar33 + fVar37);
          *(ulong *)(pfVar1 + uVar16 * 2 + 2) =
               CONCAT44(*(float *)((long)&local_88 + uVar7 * 8 + lVar15 + 4) * fVar34 + fVar39,
                        pfVar27[uVar7 * 2] * fVar34 + fVar37);
          *(ulong *)(pfVar1 + uVar16 * 2 + 4) =
               CONCAT44(fVar39 - *(float *)((long)&local_88 + uVar7 * 8 + lVar15 + 4) * fVar34,
                        fVar37 - pfVar27[uVar7 * 2] * fVar34);
          *(ulong *)(pfVar1 + uVar16 * 2 + 6) =
               CONCAT44(fVar39 - fVar33 * *(float *)((long)&local_88 + uVar7 * 8 + lVar15 + 4),
                        fVar37 - pfVar27[uVar7 * 2] * fVar33);
        }
        if (0 < (int)local_88.x) {
          pIVar10 = this->_IdxWritePtr;
          local_58._0_8_ = -((ulong)local_88 & 0xffffffff);
          IVar17.x = 1.4013e-45;
          IVar17.y = 0.0;
          uVar21 = this->_VtxCurrentIdx;
          do {
            uVar7 = (ulong)IVar17 & 0xffffffff;
            if (IVar19 == IVar17) {
              uVar7 = 0;
            }
            fVar39 = (*(float *)((long)&uStack_90 + (long)IVar17 * 8 + lVar15) + pfVar27[uVar7 * 2])
                     * 0.5;
            fVar32 = (*(float *)((long)&uStack_90 + (long)IVar17 * 8 + lVar15 + 4) +
                     *(float *)((long)&local_88 + uVar7 * 8 + lVar15 + 4)) * 0.5;
            fVar33 = fVar39 * fVar39 + fVar32 * fVar32;
            fVar37 = 0.5;
            if (0.5 <= fVar33) {
              fVar37 = fVar33;
            }
            uVar24 = uVar21 + 4;
            if (IVar19 == IVar17) {
              uVar24 = this->_VtxCurrentIdx;
            }
            fVar39 = fVar39 * (1.0 / fVar37);
            fVar32 = (1.0 / fVar37) * fVar32;
            fVar36 = (fVar34 + 1.0) * fVar39;
            fVar35 = (fVar34 + 1.0) * fVar32;
            fVar39 = fVar39 * fVar34;
            uVar16 = (ulong)(uint)((int)uVar7 << 2);
            fVar37 = points[uVar7].x;
            fVar32 = fVar32 * fVar34;
            pfVar1[uVar16 * 2] = fVar37 + fVar36;
            fVar33 = points[uVar7].y;
            pfVar1[uVar16 * 2 + 1] = fVar33 + fVar35;
            pfVar1[uVar16 * 2 + 2] = fVar37 + fVar39;
            pfVar1[uVar16 * 2 + 3] = fVar33 + fVar32;
            pfVar1[uVar16 * 2 + 4] = fVar37 - fVar39;
            pfVar1[uVar16 * 2 + 5] = fVar33 - fVar32;
            pfVar1[uVar16 * 2 + 6] = fVar37 - fVar36;
            IVar4 = (ImDrawIdx)uVar24;
            IVar25 = IVar4 + 1;
            pfVar1[uVar16 * 2 + 7] = fVar33 - fVar35;
            *pIVar10 = IVar25;
            IVar3 = (ImDrawIdx)uVar21;
            IVar18 = IVar3 + 2;
            pIVar10[1] = IVar3 + 1;
            pIVar10[2] = IVar18;
            pIVar10[3] = IVar18;
            IVar11 = IVar4 + 2;
            pIVar10[4] = IVar11;
            pIVar10[5] = IVar25;
            pIVar10[6] = IVar25;
            pIVar10[7] = IVar3 + 1;
            pIVar10[8] = IVar3;
            pIVar10[9] = IVar3;
            pIVar10[10] = IVar4;
            pIVar10[0xb] = IVar25;
            pIVar10[0xc] = IVar11;
            pIVar10[0xd] = IVar18;
            pIVar10[0xe] = IVar3 + 3;
            pIVar10[0xf] = IVar3 + 3;
            pIVar10[0x10] = IVar4 + 3;
            pIVar10[0x11] = IVar11;
            pIVar10 = pIVar10 + 0x12;
            lVar14 = local_58._0_8_ + (long)IVar17;
            IVar17 = (ImVec2)((long)IVar17 + 1);
            IVar19 = local_40;
            uVar21 = uVar24;
          } while (lVar14 != 0);
          this->_IdxWritePtr = pIVar10;
          IVar12 = local_34;
        }
        uVar7 = 1;
        if (1 < (int)local_80.x) {
          uVar7 = (ulong)local_80 & 0xffffffff;
        }
        lVar15 = 0;
        do {
          this->_VtxWritePtr->pos = *(ImVec2 *)((long)pfVar27 + lVar15 + (long)IVar19 * 8);
          this->_VtxWritePtr->uv = local_70[1];
          pIVar2 = this->_VtxWritePtr;
          pIVar2->col = uVar5;
          pIVar2[1].pos = *(ImVec2 *)((long)pfVar27 + lVar15 + (long)IVar19 * 8 + 8);
          this->_VtxWritePtr[1].uv = local_70[1];
          pIVar2 = this->_VtxWritePtr;
          pIVar2[1].col = IVar12;
          pIVar2[2].pos = *(ImVec2 *)((long)pfVar27 + lVar15 + (long)IVar19 * 8 + 0x10);
          this->_VtxWritePtr[2].uv = local_70[1];
          pIVar2 = this->_VtxWritePtr;
          pIVar2[2].col = IVar12;
          pIVar2[3].pos = *(ImVec2 *)((long)pfVar27 + lVar15 + (long)IVar19 * 8 + 0x18);
          this->_VtxWritePtr[3].uv = local_70[1];
          pIVar2 = this->_VtxWritePtr;
          pIVar2[3].col = uVar5;
          this->_VtxWritePtr = pIVar2 + 4;
          lVar15 = lVar15 + 0x20;
        } while (uVar7 * 0x20 != lVar15);
      }
      this->_VtxCurrentIdx = this->_VtxCurrentIdx + (uint)local_70[0].y._0_2_;
    }
  }
  return;
}

Assistant:

void ImDrawList::AddPolyline(const ImVec2* points, const int points_count, ImU32 col, bool closed, float thickness)
{
    if (points_count < 2)
        return;

    const ImVec2 uv = _Data->TexUvWhitePixel;

    int count = points_count;
    if (!closed)
        count = points_count-1;

    const bool thick_line = thickness > 1.0f;
    if (Flags & ImDrawListFlags_AntiAliasedLines)
    {
        // Anti-aliased stroke
        const float AA_SIZE = 1.0f;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;

        const int idx_count = thick_line ? count*18 : count*12;
        const int vtx_count = thick_line ? points_count*4 : points_count*3;
        PrimReserve(idx_count, vtx_count);

        // Temporary buffer
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * (thick_line ? 5 : 3) * sizeof(ImVec2)); //-V630
        ImVec2* temp_points = temp_normals + points_count;

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1+1) == points_count ? 0 : i1+1;
            float dx = points[i2].x - points[i1].x;
            float dy = points[i2].y - points[i1].y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i1].x = dy;
            temp_normals[i1].y = -dx;
        }
        if (!closed)
            temp_normals[points_count-1] = temp_normals[points_count-2];

        if (!thick_line)
        {
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * AA_SIZE;
                temp_points[1] = points[0] - temp_normals[0] * AA_SIZE;
                temp_points[(points_count-1)*2+0] = points[points_count-1] + temp_normals[points_count-1] * AA_SIZE;
                temp_points[(points_count-1)*2+1] = points[points_count-1] - temp_normals[points_count-1] * AA_SIZE;
            }

            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx;
            for (int i1 = 0; i1 < count; i1++)
            {
                const int i2 = (i1+1) == points_count ? 0 : i1+1;
                unsigned int idx2 = (i1+1) == points_count ? _VtxCurrentIdx : idx1+3;

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y)
                dm_x *= AA_SIZE;
                dm_y *= AA_SIZE;

                // Add temporary vertexes
                ImVec2* out_vtx = &temp_points[i2*2];
                out_vtx[0].x = points[i2].x + dm_x;
                out_vtx[0].y = points[i2].y + dm_y;
                out_vtx[1].x = points[i2].x - dm_x;
                out_vtx[1].y = points[i2].y - dm_y;

                // Add indexes
                _IdxWritePtr[0] = (ImDrawIdx)(idx2+0); _IdxWritePtr[1] = (ImDrawIdx)(idx1+0); _IdxWritePtr[2] = (ImDrawIdx)(idx1+2);
                _IdxWritePtr[3] = (ImDrawIdx)(idx1+2); _IdxWritePtr[4] = (ImDrawIdx)(idx2+2); _IdxWritePtr[5] = (ImDrawIdx)(idx2+0);
                _IdxWritePtr[6] = (ImDrawIdx)(idx2+1); _IdxWritePtr[7] = (ImDrawIdx)(idx1+1); _IdxWritePtr[8] = (ImDrawIdx)(idx1+0);
                _IdxWritePtr[9] = (ImDrawIdx)(idx1+0); _IdxWritePtr[10]= (ImDrawIdx)(idx2+0); _IdxWritePtr[11]= (ImDrawIdx)(idx2+1);
                _IdxWritePtr += 12;

                idx1 = idx2;
            }

            // Add vertexes
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = points[i];          _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
                _VtxWritePtr[1].pos = temp_points[i*2+0]; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col_trans;
                _VtxWritePtr[2].pos = temp_points[i*2+1]; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col_trans;
                _VtxWritePtr += 3;
            }
        }
        else
        {
            const float half_inner_thickness = (thickness - AA_SIZE) * 0.5f;
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[1] = points[0] + temp_normals[0] * (half_inner_thickness);
                temp_points[2] = points[0] - temp_normals[0] * (half_inner_thickness);
                temp_points[3] = points[0] - temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[(points_count-1)*4+0] = points[points_count-1] + temp_normals[points_count-1] * (half_inner_thickness + AA_SIZE);
                temp_points[(points_count-1)*4+1] = points[points_count-1] + temp_normals[points_count-1] * (half_inner_thickness);
                temp_points[(points_count-1)*4+2] = points[points_count-1] - temp_normals[points_count-1] * (half_inner_thickness);
                temp_points[(points_count-1)*4+3] = points[points_count-1] - temp_normals[points_count-1] * (half_inner_thickness + AA_SIZE);
            }

            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx;
            for (int i1 = 0; i1 < count; i1++)
            {
                const int i2 = (i1+1) == points_count ? 0 : i1+1;
                unsigned int idx2 = (i1+1) == points_count ? _VtxCurrentIdx : idx1+4;

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                float dm_out_x = dm_x * (half_inner_thickness + AA_SIZE);
                float dm_out_y = dm_y * (half_inner_thickness + AA_SIZE);
                float dm_in_x = dm_x * half_inner_thickness;
                float dm_in_y = dm_y * half_inner_thickness;

                // Add temporary vertexes
                ImVec2* out_vtx = &temp_points[i2*4];
                out_vtx[0].x = points[i2].x + dm_out_x;
                out_vtx[0].y = points[i2].y + dm_out_y;
                out_vtx[1].x = points[i2].x + dm_in_x;
                out_vtx[1].y = points[i2].y + dm_in_y;
                out_vtx[2].x = points[i2].x - dm_in_x;
                out_vtx[2].y = points[i2].y - dm_in_y;
                out_vtx[3].x = points[i2].x - dm_out_x;
                out_vtx[3].y = points[i2].y - dm_out_y;

                // Add indexes
                _IdxWritePtr[0]  = (ImDrawIdx)(idx2+1); _IdxWritePtr[1]  = (ImDrawIdx)(idx1+1); _IdxWritePtr[2]  = (ImDrawIdx)(idx1+2);
                _IdxWritePtr[3]  = (ImDrawIdx)(idx1+2); _IdxWritePtr[4]  = (ImDrawIdx)(idx2+2); _IdxWritePtr[5]  = (ImDrawIdx)(idx2+1);
                _IdxWritePtr[6]  = (ImDrawIdx)(idx2+1); _IdxWritePtr[7]  = (ImDrawIdx)(idx1+1); _IdxWritePtr[8]  = (ImDrawIdx)(idx1+0);
                _IdxWritePtr[9]  = (ImDrawIdx)(idx1+0); _IdxWritePtr[10] = (ImDrawIdx)(idx2+0); _IdxWritePtr[11] = (ImDrawIdx)(idx2+1);
                _IdxWritePtr[12] = (ImDrawIdx)(idx2+2); _IdxWritePtr[13] = (ImDrawIdx)(idx1+2); _IdxWritePtr[14] = (ImDrawIdx)(idx1+3);
                _IdxWritePtr[15] = (ImDrawIdx)(idx1+3); _IdxWritePtr[16] = (ImDrawIdx)(idx2+3); _IdxWritePtr[17] = (ImDrawIdx)(idx2+2);
                _IdxWritePtr += 18;

                idx1 = idx2;
            }

            // Add vertexes
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = temp_points[i*4+0]; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col_trans;
                _VtxWritePtr[1].pos = temp_points[i*4+1]; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col;
                _VtxWritePtr[2].pos = temp_points[i*4+2]; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col;
                _VtxWritePtr[3].pos = temp_points[i*4+3]; _VtxWritePtr[3].uv = uv; _VtxWritePtr[3].col = col_trans;
                _VtxWritePtr += 4;
            }
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // Non Anti-aliased Stroke
        const int idx_count = count*6;
        const int vtx_count = count*4;      // FIXME-OPT: Not sharing edges
        PrimReserve(idx_count, vtx_count);

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1+1) == points_count ? 0 : i1+1;
            const ImVec2& p1 = points[i1];
            const ImVec2& p2 = points[i2];

            float dx = p2.x - p1.x;
            float dy = p2.y - p1.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            dx *= (thickness * 0.5f);
            dy *= (thickness * 0.5f);

            _VtxWritePtr[0].pos.x = p1.x + dy; _VtxWritePtr[0].pos.y = p1.y - dx; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr[1].pos.x = p2.x + dy; _VtxWritePtr[1].pos.y = p2.y - dx; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col;
            _VtxWritePtr[2].pos.x = p2.x - dy; _VtxWritePtr[2].pos.y = p2.y + dx; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col;
            _VtxWritePtr[3].pos.x = p1.x - dy; _VtxWritePtr[3].pos.y = p1.y + dx; _VtxWritePtr[3].uv = uv; _VtxWritePtr[3].col = col;
            _VtxWritePtr += 4;

            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx+1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx+2);
            _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx+2); _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx+3);
            _IdxWritePtr += 6;
            _VtxCurrentIdx += 4;
        }
    }
}